

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O0

void __thiscall kj::Thread::~Thread(Thread *this)

{
  int osErrorNumber;
  Exception *pEVar1;
  undefined1 local_1a8 [8];
  Exception ecopy;
  Exception *e;
  Fault f;
  Type TStack_28;
  int pthreadResult;
  undefined1 local_20 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_thread_c__:80:5)>
  _kjDefer80;
  Thread *this_local;
  
  if ((this->detached & 1U) == 0) {
    TStack_28.this = this;
    _kjDefer80._8_8_ = this;
    defer<kj::Thread::~Thread()::__0>((kj *)local_20,&stack0xffffffffffffffd8);
    osErrorNumber = pthread_join(this->threadId,(void **)0x0);
    if (osErrorNumber != 0) {
      _::Debug::Fault::Fault
                ((Fault *)&e,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/thread.c++"
                 ,0x54,osErrorNumber,"pthread_join","");
      _::Debug::Fault::~Fault((Fault *)&e);
    }
    ecopy._336_8_ = _::readMaybe<kj::Exception>(&this->state->exception);
    if ((Exception *)ecopy._336_8_ != (Exception *)0x0) {
      pEVar1 = mv<kj::Exception>((Exception *)ecopy._336_8_);
      Exception::Exception((Exception *)local_1a8,pEVar1);
      Maybe<kj::Exception>::operator=(&this->state->exception,(void *)0x0);
      pEVar1 = mv<kj::Exception>((Exception *)local_1a8);
      throwRecoverableException(pEVar1,0);
      Exception::~Exception((Exception *)local_1a8);
    }
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/thread.c++:80:5)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_thread_c__:80:5)>
                 *)local_20);
  }
  return;
}

Assistant:

Thread::~Thread() noexcept(false) {
  if (!detached) {
    KJ_DEFER(state->unref());

    int pthreadResult = pthread_join(*reinterpret_cast<pthread_t*>(&threadId), nullptr);
    if (pthreadResult != 0) {
      KJ_FAIL_SYSCALL("pthread_join", pthreadResult) { break; }
    }

    KJ_IF_MAYBE(e, state->exception) {
      Exception ecopy = kj::mv(*e);
      state->exception = nullptr;  // don't complain of uncaught exception when deleting
      kj::throwRecoverableException(kj::mv(ecopy));
    }
  }
}